

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O3

void __thiscall UnifiedRegex::Program::Print(Program *this,DebugWriter *w)

{
  Type TVar1;
  code *pcVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  EquivScannerMixinT<1U> *pEVar11;
  byte bVar12;
  Type TVar13;
  bool bVar14;
  int iVar15;
  ulong uVar16;
  undefined4 *puVar17;
  Label LVar18;
  char16_t *pcVar19;
  char16_t *form;
  NopInst *actualInst;
  SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *this_00;
  Label LVar20;
  Label LVar21;
  ulong uVar22;
  
  bVar12 = DAT_01593300;
  uVar16 = 0;
  DebugWriter::PrintEOL(w,L"Program {");
  DebugWriter::Indent(w);
  DebugWriter::PrintEOL(w,L"source:       %s",(this->source).ptr);
  DebugWriter::Print(w,L"litbuf:       ");
  pcVar19 = (this->rep).insts.litbuf.ptr;
  if (pcVar19 == (char16_t *)0x0) {
    form = L"<NONE>";
  }
  else {
    uVar16 = (ulong)(this->rep).insts.litbufLen;
    form = L"";
    if (uVar16 != 0) {
      uVar22 = 0;
      do {
        DebugWriter::PrintEscapedChar(w,pcVar19[uVar22]);
        uVar22 = uVar22 + 1;
      } while (uVar16 != uVar22);
    }
  }
  DebugWriter::PrintEOL(w,form);
  DebugWriter::PrintEOL(w,L"litbufLen:    %u",uVar16);
  DebugWriter::Print(w,L"flags:        ");
  TVar13 = this->flags;
  if ((TVar13 & GlobalRegexFlag) != NoRegexFlags) {
    DebugWriter::Print(w,L"global ");
    TVar13 = this->flags;
  }
  if ((TVar13 & MultilineRegexFlag) != NoRegexFlags) {
    DebugWriter::Print(w,L"multiline ");
    TVar13 = this->flags;
  }
  if ((TVar13 & IgnoreCaseRegexFlag) != NoRegexFlags) {
    DebugWriter::Print(w,L"ignorecase ");
    TVar13 = this->flags;
  }
  if ((TVar13 & DotAllRegexFlag) != NoRegexFlags) {
    DebugWriter::Print(w,L"dotAll ");
    TVar13 = this->flags;
  }
  if ((TVar13 & UnicodeRegexFlag) != NoRegexFlags) {
    DebugWriter::Print(w,L"unicode ");
    TVar13 = this->flags;
  }
  if ((TVar13 & StickyRegexFlag) != NoRegexFlags) {
    DebugWriter::Print(w,L"sticky ");
  }
  DebugWriter::EOL(w);
  DebugWriter::PrintEOL(w,L"numGroups:    %d",(ulong)this->numGroups);
  DebugWriter::PrintEOL(w,L"numLoops:     %d",(ulong)(uint)this->numLoops);
  switch(this->tag) {
  case InstructionsTag:
  case BOIInstructionsTag:
    DebugWriter::PrintEOL(w,L"instructions: {");
    DebugWriter::Indent(w);
    if (this->tag == BOIInstructionsTag) {
      DebugWriter::PrintEOL(w,L"       BOITest(hardFail: true)");
    }
    uVar16 = (ulong)(this->rep).insts.instsLen;
    if (uVar16 != 0) {
      this_00 = *(SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> **)&this->rep;
      pEVar11 = &this_00->super_EquivScannerMixinT<1U>;
      LVar20 = 0;
      puVar17 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      do {
        TVar1 = (this_00->super_Inst).tag;
        if (EndAssertion < TVar1) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar17 = 1;
          bVar14 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                              ,0x16bb,"(false)","false");
          if (!bVar14) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *puVar17 = 0;
          goto LAB_00ee9c27;
        }
        iVar15 = (int)this_00;
        uVar3 = (uint)bVar12;
        uVar4 = (uint)bVar12;
        uVar5 = (uint)bVar12;
        uVar6 = (uint)bVar12;
        uVar7 = (uint)bVar12;
        uVar8 = (uint)bVar12;
        uVar9 = (uint)bVar12;
        uVar10 = (uint)bVar12;
        switch(TVar1) {
        case Nop:
          LVar21 = LVar20 + uVar3;
          LVar18 = iVar15 - (this->rep).boiLiteral2.literal;
          if (uVar3 != 0) {
            LVar18 = LVar20;
          }
          NopInst::Print((NopInst *)this_00,w,LVar18,(Char *)&switchD_00ee8a41::switchdataD_011ae008
                        );
          goto LAB_00ee9c21;
        case Fail:
          LVar21 = LVar20 + uVar5;
          LVar18 = iVar15 - (this->rep).boiLiteral2.literal;
          if (uVar5 != 0) {
            LVar18 = LVar20;
          }
          FailInst::Print((FailInst *)this_00,w,LVar18,
                          (Char *)&switchD_00ee8a41::switchdataD_011ae008);
          goto LAB_00ee9c21;
        case Succ:
          LVar21 = LVar20 + uVar5;
          LVar18 = iVar15 - (this->rep).boiLiteral2.literal;
          if (uVar5 != 0) {
            LVar18 = LVar20;
          }
          SuccInst::Print((SuccInst *)this_00,w,LVar18,
                          (Char *)&switchD_00ee8a41::switchdataD_011ae008);
          goto LAB_00ee9c21;
        case Jump:
          LVar21 = LVar20 + uVar5;
          LVar18 = iVar15 - (this->rep).boiLiteral2.literal;
          if (uVar5 != 0) {
            LVar18 = LVar20;
          }
          JumpInst::Print((JumpInst *)this_00,w,LVar18,
                          (Char *)&switchD_00ee8a41::switchdataD_011ae008);
          goto LAB_00ee9a0c;
        case JumpIfNotChar:
          LVar21 = LVar20 + uVar4;
          LVar18 = iVar15 - (this->rep).boiLiteral2.literal;
          if (uVar4 != 0) {
            LVar18 = LVar20;
          }
          JumpIfNotCharInst::Print
                    ((JumpIfNotCharInst *)this_00,w,LVar18,
                     (Char *)&switchD_00ee8a41::switchdataD_011ae008);
          goto LAB_00ee9b20;
        case MatchCharOrJump:
          LVar21 = LVar20 + uVar7;
          LVar18 = iVar15 - (this->rep).boiLiteral2.literal;
          if (uVar7 != 0) {
            LVar18 = LVar20;
          }
          MatchCharOrJumpInst::Print
                    ((MatchCharOrJumpInst *)this_00,w,LVar18,
                     (Char *)&switchD_00ee8a41::switchdataD_011ae008);
          goto LAB_00ee9b20;
        case JumpIfNotSet:
          LVar21 = LVar20 + uVar7;
          LVar18 = iVar15 - (this->rep).boiLiteral2.literal;
          if (uVar7 != 0) {
            LVar18 = LVar20;
          }
          JumpIfNotSetInst::Print
                    ((JumpIfNotSetInst *)this_00,w,LVar18,
                     (Char *)&switchD_00ee8a41::switchdataD_011ae008);
          goto LAB_00ee9bf6;
        case MatchSetOrJump:
          LVar21 = LVar20 + uVar5;
          LVar18 = iVar15 - (this->rep).boiLiteral2.literal;
          if (uVar5 != 0) {
            LVar18 = LVar20;
          }
          MatchSetOrJumpInst::Print
                    ((MatchSetOrJumpInst *)this_00,w,LVar18,
                     (Char *)&switchD_00ee8a41::switchdataD_011ae008);
          goto LAB_00ee9bf6;
        case Switch2:
          LVar21 = LVar20 + uVar8;
          LVar18 = iVar15 - (this->rep).boiLiteral2.literal;
          if (uVar8 != 0) {
            LVar18 = LVar20;
          }
          Switch2Inst::Print((Switch2Inst *)this_00,w,LVar18,(this->rep).insts.litbuf.ptr);
          goto LAB_00ee9629;
        case Switch4:
          LVar18 = iVar15 - (this->rep).boiLiteral2.literal;
          if (uVar3 != 0) {
            LVar18 = LVar20;
          }
          Switch4Inst::Print((Switch4Inst *)this_00,w,LVar18,(this->rep).insts.litbuf.ptr);
          goto LAB_00ee9196;
        case Switch8:
          LVar18 = iVar15 - (this->rep).boiLiteral2.literal;
          if (uVar6 != 0) {
            LVar18 = LVar20;
          }
          Switch8Inst::Print((Switch8Inst *)this_00,w,LVar18,(this->rep).insts.litbuf.ptr);
          goto LAB_00ee95f7;
        case Switch16:
          LVar18 = iVar15 - (this->rep).boiLiteral2.literal;
          if (uVar3 != 0) {
            LVar18 = LVar20;
          }
          Switch16Inst::Print((Switch16Inst *)this_00,w,LVar18,(this->rep).insts.litbuf.ptr);
          goto LAB_00ee902a;
        case Switch24:
          LVar18 = iVar15 - (this->rep).boiLiteral2.literal;
          if (uVar4 != 0) {
            LVar18 = LVar20;
          }
          Switch24Inst::Print((Switch24Inst *)this_00,w,LVar18,(this->rep).insts.litbuf.ptr);
          goto LAB_00ee93ae;
        case SwitchAndConsume2:
          LVar21 = LVar20 + uVar7;
          LVar18 = iVar15 - (this->rep).boiLiteral2.literal;
          if (uVar7 != 0) {
            LVar18 = LVar20;
          }
          SwitchAndConsume2Inst::Print
                    ((SwitchAndConsume2Inst *)this_00,w,LVar18,(this->rep).insts.litbuf.ptr);
          goto LAB_00ee9629;
        case SwitchAndConsume4:
          LVar18 = iVar15 - (this->rep).boiLiteral2.literal;
          if (uVar3 != 0) {
            LVar18 = LVar20;
          }
          SwitchAndConsume4Inst::Print
                    ((SwitchAndConsume4Inst *)this_00,w,LVar18,(this->rep).insts.litbuf.ptr);
LAB_00ee9196:
          LVar20 = LVar20 + bVar12;
          this_00 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                    ((long)((this_00->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data + 1) + 1);
          break;
        case SwitchAndConsume8:
          LVar18 = iVar15 - (this->rep).boiLiteral2.literal;
          if (uVar5 != 0) {
            LVar18 = LVar20;
          }
          SwitchAndConsume8Inst::Print
                    ((SwitchAndConsume8Inst *)this_00,w,LVar18,(this->rep).insts.litbuf.ptr);
LAB_00ee95f7:
          LVar20 = LVar20 + bVar12;
          this_00 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                    ((long)&(this_00->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.defv + 1);
          break;
        case SwitchAndConsume16:
          LVar18 = iVar15 - (this->rep).boiLiteral2.literal;
          if (uVar3 != 0) {
            LVar18 = LVar20;
          }
          SwitchAndConsume16Inst::Print
                    ((SwitchAndConsume16Inst *)this_00,w,LVar18,(this->rep).insts.litbuf.ptr);
LAB_00ee902a:
          LVar20 = LVar20 + bVar12;
          this_00 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                    ((long)(this_00->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                           lastOccurrence.directMap + 0x2d);
          break;
        case SwitchAndConsume24:
          LVar18 = iVar15 - (this->rep).boiLiteral2.literal;
          if (uVar4 != 0) {
            LVar18 = LVar20;
          }
          SwitchAndConsume24Inst::Print
                    ((SwitchAndConsume24Inst *)this_00,w,LVar18,(this->rep).insts.litbuf.ptr);
LAB_00ee93ae:
          LVar20 = LVar20 + bVar12;
          this_00 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                    ((long)(this_00->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                           lastOccurrence.directMap + 0x5d);
          break;
        case BOIHardFailTest:
          LVar21 = LVar20 + uVar7;
          LVar18 = iVar15 - (this->rep).boiLiteral2.literal;
          if (uVar7 != 0) {
            LVar18 = LVar20;
          }
          iVar15 = BOITestInst<true>::Print
                             ((BOITestInst<true> *)this_00,w,LVar18,(this->rep).insts.litbuf.ptr);
          goto LAB_00ee9bca;
        case BOITest:
          LVar21 = LVar20 + uVar8;
          LVar18 = iVar15 - (this->rep).boiLiteral2.literal;
          if (uVar8 != 0) {
            LVar18 = LVar20;
          }
          iVar15 = BOITestInst<false>::Print
                             ((BOITestInst<false> *)this_00,w,LVar18,(this->rep).insts.litbuf.ptr);
          goto LAB_00ee9bca;
        case EOIHardFailTest:
          LVar21 = LVar20 + uVar6;
          LVar18 = iVar15 - (this->rep).boiLiteral2.literal;
          if (uVar6 != 0) {
            LVar18 = LVar20;
          }
          iVar15 = EOITestInst<true>::Print
                             ((EOITestInst<true> *)this_00,w,LVar18,(this->rep).insts.litbuf.ptr);
          goto LAB_00ee9bca;
        case EOITest:
          LVar21 = LVar20 + uVar7;
          LVar18 = iVar15 - (this->rep).boiLiteral2.literal;
          if (uVar7 != 0) {
            LVar18 = LVar20;
          }
          iVar15 = EOITestInst<false>::Print
                             ((EOITestInst<false> *)this_00,w,LVar18,(this->rep).insts.litbuf.ptr);
          goto LAB_00ee9bca;
        case BOLTest:
          LVar21 = LVar20 + uVar8;
          LVar18 = iVar15 - (this->rep).boiLiteral2.literal;
          if (uVar8 != 0) {
            LVar18 = LVar20;
          }
          BOLTestInst::Print((BOLTestInst *)this_00,w,LVar18,
                             (Char *)&switchD_00ee8a41::switchdataD_011ae008);
          goto LAB_00ee9c21;
        case EOLTest:
          LVar21 = LVar20 + uVar8;
          LVar18 = iVar15 - (this->rep).boiLiteral2.literal;
          if (uVar8 != 0) {
            LVar18 = LVar20;
          }
          EOLTestInst::Print((EOLTestInst *)this_00,w,LVar18,
                             (Char *)&switchD_00ee8a41::switchdataD_011ae008);
          goto LAB_00ee9c21;
        case NegatedWordBoundaryTest:
          LVar21 = LVar20 + uVar5;
          LVar18 = iVar15 - (this->rep).boiLiteral2.literal;
          if (uVar5 != 0) {
            LVar18 = LVar20;
          }
          iVar15 = WordBoundaryTestInst<true>::Print
                             ((WordBoundaryTestInst<true> *)this_00,w,LVar18,
                              (this->rep).insts.litbuf.ptr);
          goto LAB_00ee9bca;
        case WordBoundaryTest:
          LVar21 = LVar20 + uVar4;
          LVar18 = iVar15 - (this->rep).boiLiteral2.literal;
          if (uVar4 != 0) {
            LVar18 = LVar20;
          }
          iVar15 = WordBoundaryTestInst<false>::Print
                             ((WordBoundaryTestInst<false> *)this_00,w,LVar18,
                              (this->rep).insts.litbuf.ptr);
          goto LAB_00ee9bca;
        case MatchChar:
          LVar21 = LVar20 + uVar8;
          LVar18 = iVar15 - (this->rep).boiLiteral2.literal;
          if (uVar8 != 0) {
            LVar18 = LVar20;
          }
          MatchCharInst::Print
                    ((MatchCharInst *)this_00,w,LVar18,
                     (Char *)&switchD_00ee8a41::switchdataD_011ae008);
          goto LAB_00ee99de;
        case MatchChar2:
          LVar21 = LVar20 + uVar3;
          LVar18 = iVar15 - (this->rep).boiLiteral2.literal;
          if (uVar3 != 0) {
            LVar18 = LVar20;
          }
          MatchChar2Inst::Print
                    ((MatchChar2Inst *)this_00,w,LVar18,
                     (Char *)&switchD_00ee8a41::switchdataD_011ae008);
          goto LAB_00ee9a0c;
        case MatchChar3:
          LVar21 = LVar20 + uVar8;
          LVar18 = iVar15 - (this->rep).boiLiteral2.literal;
          if (uVar8 != 0) {
            LVar18 = LVar20;
          }
          MatchChar3Inst::Print
                    ((MatchChar3Inst *)this_00,w,LVar18,
                     (Char *)&switchD_00ee8a41::switchdataD_011ae008);
          goto LAB_00ee9b20;
        case MatchChar4:
          LVar21 = LVar20 + uVar8;
          LVar18 = iVar15 - (this->rep).boiLiteral2.literal;
          if (uVar8 != 0) {
            LVar18 = LVar20;
          }
          MatchChar4Inst::Print
                    ((MatchChar4Inst *)this_00,w,LVar18,
                     (Char *)&switchD_00ee8a41::switchdataD_011ae008);
          goto LAB_00ee98a8;
        case MatchSet:
          LVar21 = LVar20 + uVar8;
          LVar18 = iVar15 - (this->rep).boiLiteral2.literal;
          if (uVar8 != 0) {
            LVar18 = LVar20;
          }
          iVar15 = MatchSetInst<false>::Print
                             ((MatchSetInst<false> *)this_00,w,LVar18,(this->rep).insts.litbuf.ptr);
          goto LAB_00ee9bca;
        case MatchNegatedSet:
          LVar21 = LVar20 + uVar5;
          LVar18 = iVar15 - (this->rep).boiLiteral2.literal;
          if (uVar5 != 0) {
            LVar18 = LVar20;
          }
          iVar15 = MatchSetInst<true>::Print
                             ((MatchSetInst<true> *)this_00,w,LVar18,(this->rep).insts.litbuf.ptr);
          goto LAB_00ee9bca;
        case MatchLiteral:
          LVar21 = LVar20 + uVar8;
          LVar18 = iVar15 - (this->rep).boiLiteral2.literal;
          if (uVar8 != 0) {
            LVar18 = LVar20;
          }
          MatchLiteralInst::Print((MatchLiteralInst *)this_00,w,LVar18,(this->rep).insts.litbuf.ptr)
          ;
          goto LAB_00ee98a8;
        case MatchLiteralEquiv:
          LVar21 = LVar20 + uVar3;
          LVar18 = iVar15 - (this->rep).boiLiteral2.literal;
          if (uVar3 != 0) {
            LVar18 = LVar20;
          }
          MatchLiteralEquivInst::Print
                    ((MatchLiteralEquivInst *)this_00,w,LVar18,(this->rep).insts.litbuf.ptr);
          goto LAB_00ee98a8;
        case MatchTrie:
          LVar18 = iVar15 - (this->rep).boiLiteral2.literal;
          if (uVar3 != 0) {
            LVar18 = LVar20;
          }
          MatchTrieInst::Print
                    ((MatchTrieInst *)this_00,w,LVar18,
                     (Char *)&switchD_00ee8a41::switchdataD_011ae008);
          this_00 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                    &(this_00->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                     lastOccurrence;
          LVar20 = LVar20 + uVar3;
          break;
        case OptMatchChar:
          LVar21 = LVar20 + uVar3;
          LVar18 = iVar15 - (this->rep).boiLiteral2.literal;
          if (uVar3 != 0) {
            LVar18 = LVar20;
          }
          OptMatchCharInst::Print
                    ((OptMatchCharInst *)this_00,w,LVar18,
                     (Char *)&switchD_00ee8a41::switchdataD_011ae008);
          goto LAB_00ee99de;
        case OptMatchSet:
          LVar18 = iVar15 - (this->rep).boiLiteral2.literal;
          if (uVar3 != 0) {
            LVar18 = LVar20;
          }
          OptMatchSetInst::Print
                    ((OptMatchSetInst *)this_00,w,LVar18,
                     (Char *)&switchD_00ee8a41::switchdataD_011ae008);
          this_00 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                    ((this_00->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                     lastOccurrence.isInMap.data + 3);
          LVar20 = LVar20 + uVar3;
          break;
        case SyncToCharAndContinue:
          LVar21 = LVar20 + uVar3;
          LVar18 = iVar15 - (this->rep).boiLiteral2.literal;
          if (uVar3 != 0) {
            LVar18 = LVar20;
          }
          SyncToCharAndContinueInst::Print
                    ((SyncToCharAndContinueInst *)this_00,w,LVar18,
                     (Char *)&switchD_00ee8a41::switchdataD_011ae008);
          goto LAB_00ee99de;
        case SyncToChar2SetAndContinue:
          LVar21 = LVar20 + uVar8;
          LVar18 = iVar15 - (this->rep).boiLiteral2.literal;
          if (uVar8 != 0) {
            LVar18 = LVar20;
          }
          SyncToChar2SetAndContinueInst::Print
                    ((SyncToChar2SetAndContinueInst *)this_00,w,LVar18,
                     (Char *)&switchD_00ee8a41::switchdataD_011ae008);
          goto LAB_00ee9a0c;
        case SyncToSetAndContinue:
          LVar21 = LVar20 + uVar8;
          LVar18 = iVar15 - (this->rep).boiLiteral2.literal;
          if (uVar8 != 0) {
            LVar18 = LVar20;
          }
          iVar15 = SyncToSetAndContinueInst<false>::Print
                             ((SyncToSetAndContinueInst<false> *)this_00,w,LVar18,
                              (this->rep).insts.litbuf.ptr);
          goto LAB_00ee9bca;
        case SyncToNegatedSetAndContinue:
          LVar21 = LVar20 + uVar4;
          LVar18 = iVar15 - (this->rep).boiLiteral2.literal;
          if (uVar4 != 0) {
            LVar18 = LVar20;
          }
          iVar15 = SyncToSetAndContinueInst<true>::Print
                             ((SyncToSetAndContinueInst<true> *)this_00,w,LVar18,
                              (this->rep).insts.litbuf.ptr);
          goto LAB_00ee9bca;
        case SyncToChar2LiteralAndContinue:
          LVar21 = LVar20 + uVar6;
          LVar18 = iVar15 - (this->rep).boiLiteral2.literal;
          if (uVar6 != 0) {
            LVar18 = LVar20;
          }
          SyncToLiteralAndContinueInstT<UnifiedRegex::Char2LiteralScannerMixin>::Print
                    ((SyncToLiteralAndContinueInstT<UnifiedRegex::Char2LiteralScannerMixin> *)
                     this_00,w,LVar18,(Char *)&switchD_00ee8a41::switchdataD_011ae008);
          goto LAB_00ee9a0c;
        case SyncToLiteralAndContinue:
          LVar21 = LVar20 + uVar8;
          LVar18 = iVar15 - (this->rep).boiLiteral2.literal;
          if (uVar8 != 0) {
            LVar18 = LVar20;
          }
          SyncToLiteralAndContinueInstT<UnifiedRegex::ScannerMixinT<UnifiedRegex::TextbookBoyerMoore<char16_t>_>_>
          ::Print((SyncToLiteralAndContinueInstT<UnifiedRegex::ScannerMixinT<UnifiedRegex::TextbookBoyerMoore<char16_t>_>_>
                   *)this_00,w,LVar18,(this->rep).insts.litbuf.ptr);
          goto LAB_00ee9a9a;
        case SyncToLinearLiteralAndContinue:
          LVar18 = iVar15 - (this->rep).boiLiteral2.literal;
          if (uVar3 != 0) {
            LVar18 = LVar20;
          }
          SyncToLiteralAndContinueInstT<UnifiedRegex::ScannerMixinT<UnifiedRegex::TextbookBoyerMooreWithLinearMap<char16_t>_>_>
          ::Print((SyncToLiteralAndContinueInstT<UnifiedRegex::ScannerMixinT<UnifiedRegex::TextbookBoyerMooreWithLinearMap<char16_t>_>_>
                   *)this_00,w,LVar18,(this->rep).insts.litbuf.ptr);
          goto LAB_00ee99b0;
        case SyncToLiteralEquivAndContinue:
          LVar21 = LVar20 + uVar3;
          LVar18 = iVar15 - (this->rep).boiLiteral2.literal;
          if (uVar3 != 0) {
            LVar18 = LVar20;
          }
          SyncToLiteralAndContinueInstT<UnifiedRegex::EquivScannerMixinT<4U>_>::Print
                    ((SyncToLiteralAndContinueInstT<UnifiedRegex::EquivScannerMixinT<4U>_> *)this_00
                     ,w,LVar18,(this->rep).insts.litbuf.ptr);
          goto LAB_00ee9a9a;
        case SyncToLiteralEquivTrivialLastPatCharAndContinue:
          LVar21 = LVar20 + uVar8;
          LVar18 = iVar15 - (this->rep).boiLiteral2.literal;
          if (uVar8 != 0) {
            LVar18 = LVar20;
          }
          SyncToLiteralAndContinueInstT<UnifiedRegex::EquivScannerMixinT<1U>_>::Print
                    ((SyncToLiteralAndContinueInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)this_00
                     ,w,LVar18,(this->rep).insts.litbuf.ptr);
          goto LAB_00ee9a9a;
        case SyncToCharAndConsume:
          LVar21 = LVar20 + uVar9;
          LVar18 = iVar15 - (this->rep).boiLiteral2.literal;
          if (uVar9 != 0) {
            LVar18 = LVar20;
          }
          SyncToCharAndConsumeInst::Print
                    ((SyncToCharAndConsumeInst *)this_00,w,LVar18,
                     (Char *)&switchD_00ee8a41::switchdataD_011ae008);
LAB_00ee99de:
          this_00 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                    ((long)&(this_00->super_EquivScannerMixinT<1U>).super_ScannerMixin.
                            super_LiteralMixin.offset + 2);
          LVar20 = LVar21;
          break;
        case SyncToChar2SetAndConsume:
          LVar21 = LVar20 + uVar3;
          LVar18 = iVar15 - (this->rep).boiLiteral2.literal;
          if (uVar3 != 0) {
            LVar18 = LVar20;
          }
          SyncToChar2SetAndConsumeInst::Print
                    ((SyncToChar2SetAndConsumeInst *)this_00,w,LVar18,
                     (Char *)&switchD_00ee8a41::switchdataD_011ae008);
          goto LAB_00ee9a0c;
        case SyncToSetAndConsume:
          LVar21 = LVar20 + uVar3;
          LVar18 = iVar15 - (this->rep).boiLiteral2.literal;
          if (uVar3 != 0) {
            LVar18 = LVar20;
          }
          iVar15 = SyncToSetAndConsumeInst<false>::Print
                             ((SyncToSetAndConsumeInst<false> *)this_00,w,LVar18,
                              (this->rep).insts.litbuf.ptr);
          goto LAB_00ee9bca;
        case SyncToNegatedSetAndConsume:
          LVar21 = LVar20 + uVar4;
          LVar18 = iVar15 - (this->rep).boiLiteral2.literal;
          if (uVar4 != 0) {
            LVar18 = LVar20;
          }
          iVar15 = SyncToSetAndConsumeInst<true>::Print
                             ((SyncToSetAndConsumeInst<true> *)this_00,w,LVar18,
                              (this->rep).insts.litbuf.ptr);
          goto LAB_00ee9bca;
        case SyncToChar2LiteralAndConsume:
          LVar21 = LVar20 + uVar3;
          LVar18 = iVar15 - (this->rep).boiLiteral2.literal;
          if (uVar3 != 0) {
            LVar18 = LVar20;
          }
          SyncToLiteralAndConsumeInstT<UnifiedRegex::Char2LiteralScannerMixin>::Print
                    ((SyncToLiteralAndConsumeInstT<UnifiedRegex::Char2LiteralScannerMixin> *)this_00
                     ,w,LVar18,(Char *)&switchD_00ee8a41::switchdataD_011ae008);
          goto LAB_00ee9a0c;
        case SyncToLiteralAndConsume:
          LVar21 = LVar20 + uVar9;
          LVar18 = iVar15 - (this->rep).boiLiteral2.literal;
          if (uVar9 != 0) {
            LVar18 = LVar20;
          }
          SyncToLiteralAndConsumeInstT<UnifiedRegex::ScannerMixinT<UnifiedRegex::TextbookBoyerMoore<char16_t>_>_>
          ::Print((SyncToLiteralAndConsumeInstT<UnifiedRegex::ScannerMixinT<UnifiedRegex::TextbookBoyerMoore<char16_t>_>_>
                   *)this_00,w,LVar18,(this->rep).insts.litbuf.ptr);
          goto LAB_00ee9a9a;
        case SyncToLinearLiteralAndConsume:
          LVar18 = iVar15 - (this->rep).boiLiteral2.literal;
          if (uVar7 != 0) {
            LVar18 = LVar20;
          }
          SyncToLiteralAndConsumeInstT<UnifiedRegex::ScannerMixinT<UnifiedRegex::TextbookBoyerMooreWithLinearMap<char16_t>_>_>
          ::Print((SyncToLiteralAndConsumeInstT<UnifiedRegex::ScannerMixinT<UnifiedRegex::TextbookBoyerMooreWithLinearMap<char16_t>_>_>
                   *)this_00,w,LVar18,(this->rep).insts.litbuf.ptr);
LAB_00ee99b0:
          this_00 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                    ((this_00->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                     lastOccurrence.directMap + 1);
          LVar20 = LVar20 + bVar12;
          break;
        case SyncToLiteralEquivAndConsume:
          LVar21 = LVar20 + uVar3;
          LVar18 = iVar15 - (this->rep).boiLiteral2.literal;
          if (uVar3 != 0) {
            LVar18 = LVar20;
          }
          SyncToLiteralAndConsumeInstT<UnifiedRegex::EquivScannerMixinT<4U>_>::Print
                    ((SyncToLiteralAndConsumeInstT<UnifiedRegex::EquivScannerMixinT<4U>_> *)this_00,
                     w,LVar18,(this->rep).insts.litbuf.ptr);
          goto LAB_00ee9a9a;
        case SyncToLiteralEquivTrivialLastPatCharAndConsume:
          LVar21 = LVar20 + uVar8;
          LVar18 = iVar15 - (this->rep).boiLiteral2.literal;
          if (uVar8 != 0) {
            LVar18 = LVar20;
          }
          SyncToLiteralAndConsumeInstT<UnifiedRegex::EquivScannerMixinT<1U>_>::Print
                    ((SyncToLiteralAndConsumeInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)this_00,
                     w,LVar18,(this->rep).insts.litbuf.ptr);
LAB_00ee9a9a:
          this_00 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                    &this_00->super_BackupMixin;
          LVar20 = LVar21;
          break;
        case SyncToCharAndBackup:
          LVar18 = iVar15 - (this->rep).boiLiteral2.literal;
          if (uVar8 != 0) {
            LVar18 = LVar20;
          }
          SyncToCharAndBackupInst::Print
                    ((SyncToCharAndBackupInst *)this_00,w,LVar18,
                     (Char *)&switchD_00ee8a41::switchdataD_011ae008);
          goto LAB_00ee9b98;
        case SyncToSetAndBackup:
          LVar21 = LVar20 + uVar3;
          LVar18 = iVar15 - (this->rep).boiLiteral2.literal;
          if (uVar3 != 0) {
            LVar18 = LVar20;
          }
          iVar15 = SyncToSetAndBackupInst<false>::Print
                             ((SyncToSetAndBackupInst<false> *)this_00,w,LVar18,
                              (this->rep).insts.litbuf.ptr);
          goto LAB_00ee9bca;
        case SyncToNegatedSetAndBackup:
          LVar21 = LVar20 + uVar8;
          LVar18 = iVar15 - (this->rep).boiLiteral2.literal;
          if (uVar8 != 0) {
            LVar18 = LVar20;
          }
          iVar15 = SyncToSetAndBackupInst<true>::Print
                             ((SyncToSetAndBackupInst<true> *)this_00,w,LVar18,
                              (this->rep).insts.litbuf.ptr);
          goto LAB_00ee9bca;
        case SyncToChar2LiteralAndBackup:
          LVar18 = iVar15 - (this->rep).boiLiteral2.literal;
          if (uVar3 != 0) {
            LVar18 = LVar20;
          }
          SyncToLiteralAndBackupInstT<UnifiedRegex::Char2LiteralScannerMixin>::Print
                    ((SyncToLiteralAndBackupInstT<UnifiedRegex::Char2LiteralScannerMixin> *)this_00,
                     w,LVar18,(Char *)&switchD_00ee8a41::switchdataD_011ae008);
          this_00 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                    &(this_00->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.field_0x4;
          LVar20 = LVar20 + uVar3;
          break;
        case SyncToLiteralAndBackup:
          LVar21 = LVar20 + uVar8;
          LVar18 = iVar15 - (this->rep).boiLiteral2.literal;
          if (uVar8 != 0) {
            LVar18 = LVar20;
          }
          SyncToLiteralAndBackupInstT<UnifiedRegex::ScannerMixinT<UnifiedRegex::TextbookBoyerMoore<char16_t>_>_>
          ::Print((SyncToLiteralAndBackupInstT<UnifiedRegex::ScannerMixinT<UnifiedRegex::TextbookBoyerMoore<char16_t>_>_>
                   *)this_00,w,LVar18,(this->rep).insts.litbuf.ptr);
          goto LAB_00ee9823;
        case SyncToLinearLiteralAndBackup:
          LVar18 = iVar15 - (this->rep).boiLiteral2.literal;
          if (uVar4 != 0) {
            LVar18 = LVar20;
          }
          SyncToLiteralAndBackupInstT<UnifiedRegex::ScannerMixinT<UnifiedRegex::TextbookBoyerMooreWithLinearMap<char16_t>_>_>
          ::Print((SyncToLiteralAndBackupInstT<UnifiedRegex::ScannerMixinT<UnifiedRegex::TextbookBoyerMooreWithLinearMap<char16_t>_>_>
                   *)this_00,w,LVar18,(this->rep).insts.litbuf.ptr);
          this_00 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                    ((this_00->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                     lastOccurrence.directMap + 3);
          LVar20 = LVar20 + uVar4;
          break;
        case SyncToLiteralEquivAndBackup:
          LVar21 = LVar20 + uVar7;
          LVar18 = iVar15 - (this->rep).boiLiteral2.literal;
          if (uVar7 != 0) {
            LVar18 = LVar20;
          }
          SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<4U>_>::Print
                    ((SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<4U>_> *)this_00,w
                     ,LVar18,(this->rep).insts.litbuf.ptr);
          goto LAB_00ee9823;
        case SyncToLiteralEquivTrivialLastPatCharAndBackup:
          LVar21 = LVar20 + uVar7;
          LVar18 = iVar15 - (this->rep).boiLiteral2.literal;
          if (uVar7 != 0) {
            LVar18 = LVar20;
          }
          SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_>::Print
                    (this_00,w,LVar18,(this->rep).insts.litbuf.ptr);
LAB_00ee9823:
          this_00 = this_00 + 1;
          LVar20 = LVar21;
          break;
        case SyncToLiteralsAndBackup:
          LVar18 = iVar15 - (this->rep).boiLiteral2.literal;
          if (uVar5 != 0) {
            LVar18 = LVar20;
          }
          SyncToLiteralsAndBackupInst::Print
                    ((SyncToLiteralsAndBackupInst *)this_00,w,LVar18,(this->rep).insts.litbuf.ptr);
          this_00 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                    ((long)&(this_00->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data[0].word + 4);
          LVar20 = LVar20 + uVar5;
          break;
        case MatchGroup:
          LVar21 = LVar20 + uVar4;
          LVar18 = iVar15 - (this->rep).boiLiteral2.literal;
          if (uVar4 != 0) {
            LVar18 = LVar20;
          }
          MatchGroupInst::Print
                    ((MatchGroupInst *)this_00,w,LVar18,
                     (Char *)&switchD_00ee8a41::switchdataD_011ae008);
          goto LAB_00ee9a0c;
        case BeginDefineGroup:
          LVar21 = LVar20 + uVar7;
          LVar18 = iVar15 - (this->rep).boiLiteral2.literal;
          if (uVar7 != 0) {
            LVar18 = LVar20;
          }
          BeginDefineGroupInst::Print
                    ((BeginDefineGroupInst *)this_00,w,LVar18,
                     (Char *)&switchD_00ee8a41::switchdataD_011ae008);
          goto LAB_00ee9a0c;
        case EndDefineGroup:
          LVar18 = iVar15 - (this->rep).boiLiteral2.literal;
          if (uVar3 != 0) {
            LVar18 = LVar20;
          }
          EndDefineGroupInst::Print
                    ((EndDefineGroupInst *)this_00,w,LVar18,
                     (Char *)&switchD_00ee8a41::switchdataD_011ae008);
          this_00 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                    ((long)&(this_00->super_EquivScannerMixinT<1U>).super_ScannerMixin.
                            super_LiteralMixin.length + 1);
          LVar20 = LVar20 + uVar3;
          break;
        case DefineGroupFixed:
          LVar18 = iVar15 - (this->rep).boiLiteral2.literal;
          if (uVar3 != 0) {
            LVar18 = LVar20;
          }
          DefineGroupFixedInst::Print
                    ((DefineGroupFixedInst *)this_00,w,LVar18,
                     (Char *)&switchD_00ee8a41::switchdataD_011ae008);
          this_00 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                    &(this_00->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.field_0x1;
          LVar20 = LVar20 + uVar3;
          break;
        case BeginLoop:
          LVar18 = iVar15 - (this->rep).boiLiteral2.literal;
          if (uVar8 != 0) {
            LVar18 = LVar20;
          }
          BeginLoopInst::Print
                    ((BeginLoopInst *)this_00,w,LVar18,
                     (Char *)&switchD_00ee8a41::switchdataD_011ae008);
          goto LAB_00ee9af2;
        case RepeatLoop:
          LVar21 = LVar20 + uVar3;
          LVar18 = iVar15 - (this->rep).boiLiteral2.literal;
          if (uVar3 != 0) {
            LVar18 = LVar20;
          }
          RepeatLoopInst::Print
                    ((RepeatLoopInst *)this_00,w,LVar18,
                     (Char *)&switchD_00ee8a41::switchdataD_011ae008);
          goto LAB_00ee9a0c;
        case BeginLoopIfChar:
          LVar18 = iVar15 - (this->rep).boiLiteral2.literal;
          if (uVar3 != 0) {
            LVar18 = LVar20;
          }
          BeginLoopIfCharInst::Print
                    ((BeginLoopIfCharInst *)this_00,w,LVar18,
                     (Char *)&switchD_00ee8a41::switchdataD_011ae008);
          this_00 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                    ((long)((this_00->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data + 1) + 4);
          LVar20 = LVar20 + uVar3;
          break;
        case BeginLoopIfSet:
          LVar18 = iVar15 - (this->rep).boiLiteral2.literal;
          if (uVar3 != 0) {
            LVar18 = LVar20;
          }
          BeginLoopIfSetInst::Print
                    ((BeginLoopIfSetInst *)this_00,w,LVar18,
                     (Char *)&switchD_00ee8a41::switchdataD_011ae008);
          this_00 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                    ((long)(this_00->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                           lastOccurrence.directMap + 0xe);
          LVar20 = LVar20 + uVar3;
          break;
        case RepeatLoopIfChar:
          LVar21 = LVar20 + uVar8;
          LVar18 = iVar15 - (this->rep).boiLiteral2.literal;
          if (uVar8 != 0) {
            LVar18 = LVar20;
          }
          RepeatLoopIfCharInst::Print
                    ((RepeatLoopIfCharInst *)this_00,w,LVar18,
                     (Char *)&switchD_00ee8a41::switchdataD_011ae008);
          goto LAB_00ee9a0c;
        case RepeatLoopIfSet:
          LVar21 = LVar20 + uVar9;
          LVar18 = iVar15 - (this->rep).boiLiteral2.literal;
          if (uVar9 != 0) {
            LVar18 = LVar20;
          }
          RepeatLoopIfSetInst::Print
                    ((RepeatLoopIfSetInst *)this_00,w,LVar18,
                     (Char *)&switchD_00ee8a41::switchdataD_011ae008);
          goto LAB_00ee9a0c;
        case BeginLoopFixed:
          LVar18 = iVar15 - (this->rep).boiLiteral2.literal;
          if (uVar9 != 0) {
            LVar18 = LVar20;
          }
          BeginLoopFixedInst::Print
                    ((BeginLoopFixedInst *)this_00,w,LVar18,
                     (Char *)&switchD_00ee8a41::switchdataD_011ae008);
          this_00 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                    ((long)&(this_00->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data[0].word + 6);
          LVar20 = LVar20 + uVar9;
          break;
        case RepeatLoopFixed:
          LVar21 = LVar20 + uVar3;
          LVar18 = iVar15 - (this->rep).boiLiteral2.literal;
          if (uVar3 != 0) {
            LVar18 = LVar20;
          }
          RepeatLoopFixedInst::Print
                    ((RepeatLoopFixedInst *)this_00,w,LVar18,
                     (Char *)&switchD_00ee8a41::switchdataD_011ae008);
          goto LAB_00ee9a0c;
        case LoopSet:
          LVar18 = iVar15 - (this->rep).boiLiteral2.literal;
          if (uVar6 != 0) {
            LVar18 = LVar20;
          }
          LoopSetInst::Print((LoopSetInst *)this_00,w,LVar18,
                             (Char *)&switchD_00ee8a41::switchdataD_011ae008);
          goto LAB_00ee9433;
        case LoopSetWithFollowFirst:
          LVar18 = iVar15 - (this->rep).boiLiteral2.literal;
          if (uVar3 != 0) {
            LVar18 = LVar20;
          }
          LoopSetWithFollowFirstInst::Print
                    ((LoopSetWithFollowFirstInst *)this_00,w,LVar18,
                     (Char *)&switchD_00ee8a41::switchdataD_011ae008);
          this_00 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                    ((long)(this_00->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                           lastOccurrence.directMap + 3);
          LVar20 = LVar20 + uVar3;
          break;
        case BeginLoopFixedGroupLastIteration:
          LVar18 = iVar15 - (this->rep).boiLiteral2.literal;
          if (uVar9 != 0) {
            LVar18 = LVar20;
          }
          BeginLoopFixedGroupLastIterationInst::Print
                    ((BeginLoopFixedGroupLastIterationInst *)this_00,w,LVar18,
                     (Char *)&switchD_00ee8a41::switchdataD_011ae008);
LAB_00ee9af2:
          this_00 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                    ((long)((this_00->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data + 1) + 3);
          LVar20 = LVar20 + bVar12;
          break;
        case RepeatLoopFixedGroupLastIteration:
          LVar21 = LVar20 + uVar3;
          LVar18 = iVar15 - (this->rep).boiLiteral2.literal;
          if (uVar3 != 0) {
            LVar18 = LVar20;
          }
          RepeatLoopFixedGroupLastIterationInst::Print
                    ((RepeatLoopFixedGroupLastIterationInst *)this_00,w,LVar18,
                     (Char *)&switchD_00ee8a41::switchdataD_011ae008);
          goto LAB_00ee9a0c;
        case BeginGreedyLoopNoBacktrack:
          LVar21 = LVar20 + uVar3;
          LVar18 = iVar15 - (this->rep).boiLiteral2.literal;
          if (uVar3 != 0) {
            LVar18 = LVar20;
          }
          BeginGreedyLoopNoBacktrackInst::Print
                    ((BeginGreedyLoopNoBacktrackInst *)this_00,w,LVar18,
                     (Char *)&switchD_00ee8a41::switchdataD_011ae008);
LAB_00ee98a8:
          this_00 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                    &(this_00->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner;
          LVar20 = LVar21;
          break;
        case RepeatGreedyLoopNoBacktrack:
          LVar21 = LVar20 + uVar3;
          LVar18 = iVar15 - (this->rep).boiLiteral2.literal;
          if (uVar3 != 0) {
            LVar18 = LVar20;
          }
          RepeatGreedyLoopNoBacktrackInst::Print
                    ((RepeatGreedyLoopNoBacktrackInst *)this_00,w,LVar18,
                     (Char *)&switchD_00ee8a41::switchdataD_011ae008);
          goto LAB_00ee9a0c;
        case ChompCharStar:
          LVar21 = LVar20 + uVar3;
          LVar18 = iVar15 - (this->rep).boiLiteral2.literal;
          if (uVar3 != 0) {
            LVar18 = LVar20;
          }
          iVar15 = ChompCharInst<(UnifiedRegex::ChompMode)0>::Print
                             ((ChompCharInst<(UnifiedRegex::ChompMode)0> *)this_00,w,LVar18,
                              (this->rep).insts.litbuf.ptr);
          goto LAB_00ee9bca;
        case ChompCharPlus:
          LVar21 = LVar20 + uVar3;
          LVar18 = iVar15 - (this->rep).boiLiteral2.literal;
          if (uVar3 != 0) {
            LVar18 = LVar20;
          }
          iVar15 = ChompCharInst<(UnifiedRegex::ChompMode)1>::Print
                             ((ChompCharInst<(UnifiedRegex::ChompMode)1> *)this_00,w,LVar18,
                              (this->rep).insts.litbuf.ptr);
          goto LAB_00ee9bca;
        case ChompSetStar:
          LVar21 = LVar20 + uVar3;
          LVar18 = iVar15 - (this->rep).boiLiteral2.literal;
          if (uVar3 != 0) {
            LVar18 = LVar20;
          }
          iVar15 = ChompSetInst<(UnifiedRegex::ChompMode)0>::Print
                             ((ChompSetInst<(UnifiedRegex::ChompMode)0> *)this_00,w,LVar18,
                              (this->rep).insts.litbuf.ptr);
          goto LAB_00ee9bca;
        case ChompSetPlus:
          LVar21 = LVar20 + uVar8;
          LVar18 = iVar15 - (this->rep).boiLiteral2.literal;
          if (uVar8 != 0) {
            LVar18 = LVar20;
          }
          iVar15 = ChompSetInst<(UnifiedRegex::ChompMode)1>::Print
                             ((ChompSetInst<(UnifiedRegex::ChompMode)1> *)this_00,w,LVar18,
                              (this->rep).insts.litbuf.ptr);
          goto LAB_00ee9bca;
        case ChompCharGroupStar:
          LVar21 = LVar20 + uVar8;
          LVar18 = iVar15 - (this->rep).boiLiteral2.literal;
          if (uVar8 != 0) {
            LVar18 = LVar20;
          }
          iVar15 = ChompCharGroupInst<(UnifiedRegex::ChompMode)0>::Print
                             ((ChompCharGroupInst<(UnifiedRegex::ChompMode)0> *)this_00,w,LVar18,
                              (this->rep).insts.litbuf.ptr);
          goto LAB_00ee9bca;
        case ChompCharGroupPlus:
          LVar21 = LVar20 + uVar9;
          LVar18 = iVar15 - (this->rep).boiLiteral2.literal;
          if (uVar9 != 0) {
            LVar18 = LVar20;
          }
          iVar15 = ChompCharGroupInst<(UnifiedRegex::ChompMode)1>::Print
                             ((ChompCharGroupInst<(UnifiedRegex::ChompMode)1> *)this_00,w,LVar18,
                              (this->rep).insts.litbuf.ptr);
          goto LAB_00ee9bca;
        case ChompSetGroupStar:
          LVar21 = LVar20 + uVar3;
          LVar18 = iVar15 - (this->rep).boiLiteral2.literal;
          if (uVar3 != 0) {
            LVar18 = LVar20;
          }
          iVar15 = ChompSetGroupInst<(UnifiedRegex::ChompMode)0>::Print
                             ((ChompSetGroupInst<(UnifiedRegex::ChompMode)0> *)this_00,w,LVar18,
                              (this->rep).insts.litbuf.ptr);
          goto LAB_00ee9bca;
        case ChompSetGroupPlus:
          LVar21 = LVar20 + uVar10;
          LVar18 = iVar15 - (this->rep).boiLiteral2.literal;
          if (uVar10 != 0) {
            LVar18 = LVar20;
          }
          iVar15 = ChompSetGroupInst<(UnifiedRegex::ChompMode)1>::Print
                             ((ChompSetGroupInst<(UnifiedRegex::ChompMode)1> *)this_00,w,LVar18,
                              (this->rep).insts.litbuf.ptr);
LAB_00ee9bca:
          this_00 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                    ((long)(this_00->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                           lastOccurrence.isInMap.data + (long)iVar15 + -0x11);
          LVar20 = LVar21;
          break;
        case ChompCharBounded:
          LVar18 = iVar15 - (this->rep).boiLiteral2.literal;
          if (uVar9 != 0) {
            LVar18 = LVar20;
          }
          ChompCharBoundedInst::Print
                    ((ChompCharBoundedInst *)this_00,w,LVar18,
                     (Char *)&switchD_00ee8a41::switchdataD_011ae008);
LAB_00ee9b98:
          this_00 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                    &(this_00->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.field_0x2;
          LVar20 = LVar20 + bVar12;
          break;
        case ChompSetBounded:
          LVar18 = iVar15 - (this->rep).boiLiteral2.literal;
          if (uVar3 != 0) {
            LVar18 = LVar20;
          }
          ChompSetBoundedInst::Print
                    ((ChompSetBoundedInst *)this_00,w,LVar18,
                     (Char *)&switchD_00ee8a41::switchdataD_011ae008);
          this_00 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                    &(this_00->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                     lastOccurrence.defv;
          LVar20 = LVar20 + uVar3;
          break;
        case ChompSetBoundedGroupLastChar:
          LVar18 = iVar15 - (this->rep).boiLiteral2.literal;
          if (uVar5 != 0) {
            LVar18 = LVar20;
          }
          ChompSetBoundedGroupLastCharInst::Print
                    ((ChompSetBoundedGroupLastCharInst *)this_00,w,LVar18,
                     (Char *)&switchD_00ee8a41::switchdataD_011ae008);
LAB_00ee9433:
          this_00 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                    ((long)(this_00->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                           lastOccurrence.directMap + 1);
          LVar20 = LVar20 + bVar12;
          break;
        case Try:
          LVar21 = LVar20 + uVar3;
          LVar18 = iVar15 - (this->rep).boiLiteral2.literal;
          if (uVar3 != 0) {
            LVar18 = LVar20;
          }
          TryInst::Print((TryInst *)this_00,w,LVar18,(Char *)&switchD_00ee8a41::switchdataD_011ae008
                        );
LAB_00ee9a0c:
          this_00 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                    &(this_00->super_EquivScannerMixinT<1U>).super_ScannerMixin.super_LiteralMixin.
                     length;
          LVar20 = LVar21;
          break;
        case TryIfChar:
          LVar21 = LVar20 + uVar5;
          LVar18 = iVar15 - (this->rep).boiLiteral2.literal;
          if (uVar5 != 0) {
            LVar18 = LVar20;
          }
          TryIfCharInst::Print
                    ((TryIfCharInst *)this_00,w,LVar18,
                     (Char *)&switchD_00ee8a41::switchdataD_011ae008);
          goto LAB_00ee9b20;
        case TryMatchChar:
          LVar21 = LVar20 + uVar9;
          LVar18 = iVar15 - (this->rep).boiLiteral2.literal;
          if (uVar9 != 0) {
            LVar18 = LVar20;
          }
          TryMatchCharInst::Print
                    ((TryMatchCharInst *)this_00,w,LVar18,
                     (Char *)&switchD_00ee8a41::switchdataD_011ae008);
LAB_00ee9b20:
          this_00 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                    ((long)&(this_00->super_EquivScannerMixinT<1U>).super_ScannerMixin.
                            super_LiteralMixin.length + 2);
          LVar20 = LVar21;
          break;
        case TryIfSet:
          LVar21 = LVar20 + uVar3;
          LVar18 = iVar15 - (this->rep).boiLiteral2.literal;
          if (uVar3 != 0) {
            LVar18 = LVar20;
          }
          TryIfSetInst::Print((TryIfSetInst *)this_00,w,LVar18,
                              (Char *)&switchD_00ee8a41::switchdataD_011ae008);
          goto LAB_00ee9bf6;
        case TryMatchSet:
          LVar21 = LVar20 + uVar10;
          LVar18 = iVar15 - (this->rep).boiLiteral2.literal;
          if (uVar10 != 0) {
            LVar18 = LVar20;
          }
          TryMatchSetInst::Print
                    ((TryMatchSetInst *)this_00,w,LVar18,
                     (Char *)&switchD_00ee8a41::switchdataD_011ae008);
LAB_00ee9bf6:
          this_00 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                    ((long)((this_00->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data + 3) + 4);
          LVar20 = LVar21;
          break;
        case BeginAssertion:
          LVar21 = LVar20 + uVar5;
          LVar18 = iVar15 - (this->rep).boiLiteral2.literal;
          if (uVar5 != 0) {
            LVar18 = LVar20;
          }
          BeginAssertionInst::Print
                    ((BeginAssertionInst *)this_00,w,LVar18,
                     (Char *)&switchD_00ee8a41::switchdataD_011ae008);
LAB_00ee9629:
          this_00 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                    &(this_00->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.field_0x5;
          LVar20 = LVar21;
          break;
        case EndAssertion:
          LVar21 = LVar20 + uVar10;
          LVar18 = iVar15 - (this->rep).boiLiteral2.literal;
          if (uVar10 != 0) {
            LVar18 = LVar20;
          }
          EndAssertionInst::Print
                    ((EndAssertionInst *)this_00,w,LVar18,
                     (Char *)&switchD_00ee8a41::switchdataD_011ae008);
LAB_00ee9c21:
          this_00 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                    &this_00->super_EquivScannerMixinT<1U>;
          LVar20 = LVar21;
        }
LAB_00ee9c27:
      } while (this_00 !=
               (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
               ((long)(pEVar11->super_ScannerMixin).scanner.lastOccurrence.isInMap.data +
               (uVar16 - 0x11)));
    }
    DebugWriter::Unindent(w);
    pcVar19 = L"}";
    break;
  default:
    goto switchD_00ee89be_caseD_2;
  case SingleCharTag:
    DebugWriter::Print(w,L"special form: <match single char ");
    DebugWriter::PrintQuotedChar(w,(this->rep).singleChar.c);
    goto LAB_00ee9c7f;
  case BoundedWordTag:
    pcVar19 = L"special form: <match bounded word>";
    break;
  case LeadingTrailingSpacesTag:
    DebugWriter::PrintEOL
              (w,L"special form: <match leading/trailing spaces: minBegin=%d minEnd=%d>",
               (ulong)(this->rep).boiLiteral2.literal,
               (ulong)(this->rep).leadingTrailingSpaces.endMinMatch);
    goto switchD_00ee89be_caseD_2;
  case OctoquadTag:
    DebugWriter::Print(w,L"special form: <octoquad ");
    OctoquadMatcher::Print((OctoquadMatcher *)(this->rep).insts.insts.ptr,w);
LAB_00ee9c7f:
    pcVar19 = L">";
  }
  DebugWriter::PrintEOL(w,pcVar19);
switchD_00ee89be_caseD_2:
  DebugWriter::Unindent(w);
  DebugWriter::PrintEOL(w,L"}");
  return;
}

Assistant:

void Program::Print(DebugWriter* w)
    {
        const bool isBaselineMode = Js::Configuration::Global.flags.BaselineMode;
        w->PrintEOL(_u("Program {"));
        w->Indent();
        w->PrintEOL(_u("source:       %s"), PointerValue(source));

        w->Print(_u("litbuf:       "));
        const char16 *litbuf = this->rep.insts.litbuf;
        size_t litbufLen = 0;
        if (litbuf == nullptr)
        {
            w->PrintEOL(_u("<NONE>"));
        }
        else
        {
            litbufLen = this->rep.insts.litbufLen;
            for (size_t i = 0; i < litbufLen; ++i)
            {
                const char16 c = (char16)litbuf[i];
                w->PrintEscapedChar(c);
            }
            w->PrintEOL(_u(""));
        }
        w->PrintEOL(_u("litbufLen:    %u"), litbufLen);

        w->Print(_u("flags:        "));
        if ((flags & GlobalRegexFlag) != 0) w->Print(_u("global "));
        if ((flags & MultilineRegexFlag) != 0) w->Print(_u("multiline "));
        if ((flags & IgnoreCaseRegexFlag) != 0) w->Print(_u("ignorecase "));
        if ((flags & DotAllRegexFlag) != 0) w->Print(_u("dotAll "));
        if ((flags & UnicodeRegexFlag) != 0) w->Print(_u("unicode "));
        if ((flags & StickyRegexFlag) != 0) w->Print(_u("sticky "));
        w->EOL();
        w->PrintEOL(_u("numGroups:    %d"), numGroups);
        w->PrintEOL(_u("numLoops:     %d"), numLoops);
        switch (tag)
        {
        case ProgramTag::BOIInstructionsTag:
        case ProgramTag::InstructionsTag:
            {
                w->PrintEOL(_u("instructions: {"));
                w->Indent();
                if (tag == ProgramTag::BOIInstructionsTag)
                {
                    w->PrintEOL(_u("       BOITest(hardFail: true)"));
                }
                uint8* instsLim = rep.insts.insts + rep.insts.instsLen;
                uint8* curr = rep.insts.insts;
                int i = 0;
                while (curr != instsLim)
                {
                    const Inst *inst = (const Inst*)curr;
                    switch (inst->tag)
                    {
#define MBase(TagName, ClassName) \
                    case Inst::InstTag::TagName: \
                    { \
                        const ClassName *actualInst = static_cast<const ClassName *>(inst); \
                        curr += actualInst->Print(w, (Label)(isBaselineMode ? i++ : curr - rep.insts.insts), rep.insts.litbuf); \
                        break; \
                    }
#define M(TagName) MBase(TagName, TagName##Inst)
#define MTemplate(TagName, TemplateDeclaration, GenericClassName, SpecializedClassName) MBase(TagName, SpecializedClassName)
#include "RegexOpCodes.h"
#undef MBase
#undef M
#undef MTemplate
                    default:
                        Assert(false);
                        __assume(false);
                    }
                }
                w->Unindent();
                w->PrintEOL(_u("}"));
            }
            break;
        case ProgramTag::SingleCharTag:
            w->Print(_u("special form: <match single char "));
            w->PrintQuotedChar(rep.singleChar.c);
            w->PrintEOL(_u(">"));
            break;
        case ProgramTag::BoundedWordTag:
            w->PrintEOL(_u("special form: <match bounded word>"));
            break;
        case ProgramTag::LeadingTrailingSpacesTag:
            w->PrintEOL(_u("special form: <match leading/trailing spaces: minBegin=%d minEnd=%d>"),
                rep.leadingTrailingSpaces.beginMinMatch, rep.leadingTrailingSpaces.endMinMatch);
            break;
        case ProgramTag::OctoquadTag:
            w->Print(_u("special form: <octoquad "));
            rep.octoquad.matcher->Print(w);
            w->PrintEOL(_u(">"));
            break;
        }
        w->Unindent();
        w->PrintEOL(_u("}"));
    }